

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * parse_array(cJSON *item,char *value)

{
  char *pcVar1;
  cJSON *item_00;
  cJSON *item_01;
  char *pcVar2;
  bool bVar3;
  
  pcVar1 = value;
  if (*value == '[') {
    item->type = 5;
    pcVar1 = value + 1;
    do {
      pcVar2 = pcVar1;
      pcVar1 = pcVar2 + 1;
    } while ((byte)(*pcVar2 - 1U) < 0x20);
    if (*pcVar2 == ']') {
      return pcVar2 + 1;
    }
    item_00 = (cJSON *)(*cJSON_malloc)(0x40);
    if (item_00 == (cJSON *)0x0) {
      item->child = (cJSON *)0x0;
      pcVar1 = ep;
    }
    else {
      pcVar2 = pcVar2 + -1;
      item_00->valuedouble = 0.0;
      item_00->string = (char *)0x0;
      item_00->valuestring = (char *)0x0;
      *(undefined8 *)&item_00->valueint = 0;
      item_00->child = (cJSON *)0x0;
      *(undefined8 *)&item_00->type = 0;
      item_00->next = (cJSON *)0x0;
      item_00->prev = (cJSON *)0x0;
      item->child = item_00;
      do {
        pcVar1 = pcVar2 + 1;
        pcVar2 = pcVar2 + 1;
      } while ((byte)(*pcVar1 - 1U) < 0x20);
      pcVar2 = parse_value(item_00,pcVar2);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = pcVar2 + -1;
        do {
          pcVar1 = pcVar2 + 1;
          pcVar2 = pcVar2 + 1;
        } while ((byte)(*pcVar1 - 1U) < 0x20);
      }
      pcVar1 = ep;
      if (pcVar2 != (char *)0x0) {
        while (*pcVar2 == ',') {
          item_01 = (cJSON *)(*cJSON_malloc)(0x40);
          if (item_01 == (cJSON *)0x0) {
            bVar3 = false;
          }
          else {
            item_01->valuedouble = 0.0;
            item_01->string = (char *)0x0;
            item_01->valuestring = (char *)0x0;
            *(undefined8 *)&item_01->valueint = 0;
            item_01->child = (cJSON *)0x0;
            *(undefined8 *)&item_01->type = 0;
            item_01->next = (cJSON *)0x0;
            item_01->prev = (cJSON *)0x0;
            item_00->next = item_01;
            item_01->prev = item_00;
            do {
              pcVar1 = pcVar2 + 1;
              pcVar2 = pcVar2 + 1;
            } while ((byte)(*pcVar1 - 1U) < 0x20);
            pcVar2 = parse_value(item_01,pcVar2);
            if (pcVar2 != (char *)0x0) {
              pcVar2 = pcVar2 + -1;
              do {
                pcVar1 = pcVar2 + 1;
                pcVar2 = pcVar2 + 1;
              } while ((byte)(*pcVar1 - 1U) < 0x20);
            }
            bVar3 = pcVar2 != (char *)0x0;
            item_00 = item_01;
          }
          if (!bVar3) {
            return (char *)0x0;
          }
        }
        pcVar1 = pcVar2;
        if (*pcVar2 == ']') {
          return pcVar2 + 1;
        }
      }
    }
  }
  ep = pcVar1;
  return (char *)0x0;
}

Assistant:

static const char *parse_array(cJSON *item,const char *value)
{
	cJSON *child;
	if (*value!='[')	{ep=value;return 0;}	/* not an array! */

	item->type=cJSON_Array;
	value=skip(value+1);
	if (*value==']') return value+1;	/* empty array. */

	item->child=child=cJSON_New_Item();
	if (!item->child) return 0;		 /* memory fail */
	value=skip(parse_value(child,skip(value)));	/* skip any spacing, get the value. */
	if (!value) return 0;

	while (*value==',')
	{
		cJSON *new_item;
		if (!(new_item=cJSON_New_Item())) return 0; 	/* memory fail */
		child->next=new_item;new_item->prev=child;child=new_item;
		value=skip(parse_value(child,skip(value+1)));
		if (!value) return 0;	/* memory fail */
	}

	if (*value==']') return value+1;	/* end of array */
	ep=value;return 0;	/* malformed. */
}